

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageControl::setCurrentIndex(PageControl *this,int index)

{
  int _t2;
  PageControlPrivate *pPVar1;
  int prev;
  int index_local;
  PageControl *this_local;
  
  pPVar1 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
           ::operator->(&this->d);
  if ((pPVar1->currentIndex != index) && (-1 < index)) {
    pPVar1 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
             ::operator->(&this->d);
    if (index < pPVar1->count) {
      pPVar1 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      _t2 = pPVar1->currentIndex;
      pPVar1 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      pPVar1->currentIndex = index;
      pPVar1 = QScopedPointer<QtMWidgets::PageControlPrivate,_QScopedPointerDeleter<QtMWidgets::PageControlPrivate>_>
               ::operator->(&this->d);
      currentChanged(this,pPVar1->currentIndex,_t2);
      QWidget::update();
    }
  }
  return;
}

Assistant:

void
PageControl::setCurrentIndex( int index )
{
	if( d->currentIndex != index && index >= 0 && index < d->count )
	{
		const int prev = d->currentIndex;

		d->currentIndex = index;

		emit currentChanged( d->currentIndex, prev );

		update();
	}
}